

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::WasmByteCodeWriter::TryWriteWasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,RegSlot value,uint32 slotIndex,uint32 offset,
          ViewType viewType)

{
  Data *this_00;
  uint *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  uint32 local_2f;
  undefined1 local_2b;
  undefined1 local_2a;
  ViewType local_29;
  OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if ((((DAT_0159efbd == '\0') && (DAT_0159efbc == '\0')) &&
      (local_2a = (undefined1)value, value < 0x100)) &&
     (local_2b = (undefined1)slotIndex, slotIndex < 0x100)) {
    local_2f = offset;
    local_29 = viewType;
    bVar3 = OpCodeUtilAsmJs::IsValidByteCodeOpcode(op);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/AsmJsByteCodeWriter.cpp"
                                  ,0x11,"(OpCodeUtilAsmJs::IsValidByteCodeOpcode(op))",
                                  "OpCodeUtilAsmJs::IsValidByteCodeOpcode(op)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
    ByteCodeWriter::Data::EncodeOpCode<(Js::LayoutSize)0>(this_00,op,&this->super_ByteCodeWriter);
    if ((ushort)(op - StartCall) < 0xfff8) {
      puVar1 = &(this->super_ByteCodeWriter).m_byteCodeWithoutLDACount;
      *puVar1 = *puVar1 + 1;
    }
    ByteCodeWriter::IncreaseByteCodeCount(&this->super_ByteCodeWriter);
    ByteCodeWriter::Data::Write(this_00,&local_2f,7);
    return true;
  }
  return false;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteWasmMemAccess(OpCodeAsmJs op, RegSlot value, uint32 slotIndex, uint32 offset, ArrayBufferView::ViewType viewType)
    {
        OpLayoutT_WasmMemAccess<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value) && SizePolicy::template Assign<ArrayBufferView::ViewType>(layout.ViewType, viewType)
            && SizePolicy::Assign(layout.SlotIndex, slotIndex)
            && SizePolicy::Assign(layout.Offset, offset))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }